

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kex.c
# Opt level: O0

int kexinit(LIBSSH2_SESSION *session)

{
  uint32_t list_strlen;
  uint32_t list_strlen_00;
  uint32_t list_strlen_01;
  uint32_t list_strlen_02;
  uint32_t list_strlen_03;
  uint32_t list_strlen_04;
  uint32_t list_strlen_05;
  uint32_t list_strlen_06;
  uint32_t list_strlen_07;
  int iVar1;
  uint32_t uVar2;
  LIBSSH2_HOSTKEY_METHOD **ppLVar3;
  LIBSSH2_CRYPT_METHOD **ppLVar4;
  LIBSSH2_MAC_METHOD **ppLVar5;
  LIBSSH2_COMP_METHOD **ppLVar6;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  ulong local_70;
  ulong local_68;
  uint32_t lang_sc_len;
  uint32_t lang_cs_len;
  uint32_t mac_sc_len;
  uint32_t mac_cs_len;
  uint32_t comp_sc_len;
  uint32_t comp_cs_len;
  uint32_t crypt_sc_len;
  uint32_t crypt_cs_len;
  uint32_t hostkey_len;
  uint32_t kex_len;
  int rc;
  uchar *s;
  uchar *data;
  size_t data_len;
  LIBSSH2_SESSION *session_local;
  
  if (session->kexinit_state == libssh2_NB_state_idle) {
    if (session->kex_prefs == (char *)0x0) {
      local_68 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)libssh2_kex_methods);
    }
    else {
      local_68 = strlen(session->kex_prefs);
    }
    uVar2 = (uint32_t)local_68;
    if (session->hostkey_prefs == (char *)0x0) {
      ppLVar3 = libssh2_hostkey_methods();
      local_70 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar3);
    }
    else {
      local_70 = strlen(session->hostkey_prefs);
    }
    list_strlen = (uint32_t)local_70;
    if ((session->local).crypt_prefs == (char *)0x0) {
      ppLVar4 = libssh2_crypt_methods();
      local_78 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar4);
    }
    else {
      local_78 = strlen((session->local).crypt_prefs);
    }
    list_strlen_00 = (uint32_t)local_78;
    if ((session->remote).crypt_prefs == (char *)0x0) {
      ppLVar4 = libssh2_crypt_methods();
      local_80 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar4);
    }
    else {
      local_80 = strlen((session->remote).crypt_prefs);
    }
    list_strlen_01 = (uint32_t)local_80;
    if ((session->local).mac_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_mac_methods();
      local_88 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar5);
    }
    else {
      local_88 = strlen((session->local).mac_prefs);
    }
    list_strlen_02 = (uint32_t)local_88;
    if ((session->remote).mac_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_mac_methods();
      local_90 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar5);
    }
    else {
      local_90 = strlen((session->remote).mac_prefs);
    }
    list_strlen_03 = (uint32_t)local_90;
    if ((session->local).comp_prefs == (char *)0x0) {
      ppLVar6 = _libssh2_comp_methods(session);
      local_98 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar6);
    }
    else {
      local_98 = strlen((session->local).comp_prefs);
    }
    list_strlen_04 = (uint32_t)local_98;
    if ((session->remote).comp_prefs == (char *)0x0) {
      ppLVar6 = _libssh2_comp_methods(session);
      local_a0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)ppLVar6);
    }
    else {
      local_a0 = strlen((session->remote).comp_prefs);
    }
    list_strlen_05 = (uint32_t)local_a0;
    if ((session->local).lang_prefs == (char *)0x0) {
      local_a8 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)0x0);
    }
    else {
      local_a8 = strlen((session->local).lang_prefs);
    }
    list_strlen_06 = (uint32_t)local_a8;
    if ((session->remote).lang_prefs == (char *)0x0) {
      local_b0 = kex_method_strlen((LIBSSH2_COMMON_METHOD **)0x0);
    }
    else {
      local_b0 = strlen((session->remote).lang_prefs);
    }
    list_strlen_07 = (uint32_t)local_b0;
    data = (uchar *)((ulong)(uVar2 + list_strlen + list_strlen_00 + list_strlen_01 + list_strlen_04
                             + list_strlen_05 + list_strlen_02 + list_strlen_03 + list_strlen_06 +
                            list_strlen_07) + 0x3e);
    s = (uchar *)(*session->alloc)((size_t)data,&session->abstract);
    if (s == (uchar *)0x0) {
      iVar1 = _libssh2_error(session,-6,"Unable to allocate memory");
      return iVar1;
    }
    *s = '\x14';
    iVar1 = _libssh2_openssl_random(s + 1,0x10);
    if (iVar1 != 0) {
      iVar1 = _libssh2_error(session,-0x31,"Unable to get random bytes for KEXINIT cookie");
      return iVar1;
    }
    _kex_len = s + 0x11;
    if (session->kex_prefs == (char *)0x0) {
      uVar2 = kex_method_list(_kex_len,uVar2,(LIBSSH2_COMMON_METHOD **)libssh2_kex_methods);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,uVar2);
      memcpy(s + 0x15,session->kex_prefs,local_68 & 0xffffffff);
      _kex_len = s + 0x15 + (local_68 & 0xffffffff);
    }
    if (session->hostkey_prefs == (char *)0x0) {
      ppLVar3 = libssh2_hostkey_methods();
      uVar2 = kex_method_list(_kex_len,list_strlen,(LIBSSH2_COMMON_METHOD **)ppLVar3);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen);
      memcpy(_kex_len + 4,session->hostkey_prefs,local_70 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_70 & 0xffffffff);
    }
    if ((session->local).crypt_prefs == (char *)0x0) {
      ppLVar4 = libssh2_crypt_methods();
      uVar2 = kex_method_list(_kex_len,list_strlen_00,(LIBSSH2_COMMON_METHOD **)ppLVar4);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_00);
      memcpy(_kex_len + 4,(session->local).crypt_prefs,local_78 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_78 & 0xffffffff);
    }
    if ((session->remote).crypt_prefs == (char *)0x0) {
      ppLVar4 = libssh2_crypt_methods();
      uVar2 = kex_method_list(_kex_len,list_strlen_01,(LIBSSH2_COMMON_METHOD **)ppLVar4);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_01);
      memcpy(_kex_len + 4,(session->remote).crypt_prefs,local_80 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_80 & 0xffffffff);
    }
    if ((session->local).mac_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_mac_methods();
      uVar2 = kex_method_list(_kex_len,list_strlen_02,(LIBSSH2_COMMON_METHOD **)ppLVar5);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_02);
      memcpy(_kex_len + 4,(session->local).mac_prefs,local_88 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_88 & 0xffffffff);
    }
    if ((session->remote).mac_prefs == (char *)0x0) {
      ppLVar5 = _libssh2_mac_methods();
      uVar2 = kex_method_list(_kex_len,list_strlen_03,(LIBSSH2_COMMON_METHOD **)ppLVar5);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_03);
      memcpy(_kex_len + 4,(session->remote).mac_prefs,local_90 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_90 & 0xffffffff);
    }
    if ((session->local).comp_prefs == (char *)0x0) {
      ppLVar6 = _libssh2_comp_methods(session);
      uVar2 = kex_method_list(_kex_len,list_strlen_04,(LIBSSH2_COMMON_METHOD **)ppLVar6);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_04);
      memcpy(_kex_len + 4,(session->local).comp_prefs,local_98 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_98 & 0xffffffff);
    }
    if ((session->remote).comp_prefs == (char *)0x0) {
      ppLVar6 = _libssh2_comp_methods(session);
      uVar2 = kex_method_list(_kex_len,list_strlen_05,(LIBSSH2_COMMON_METHOD **)ppLVar6);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_05);
      memcpy(_kex_len + 4,(session->remote).comp_prefs,local_a0 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_a0 & 0xffffffff);
    }
    if ((session->local).lang_prefs == (char *)0x0) {
      uVar2 = kex_method_list(_kex_len,list_strlen_06,(LIBSSH2_COMMON_METHOD **)0x0);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_06);
      memcpy(_kex_len + 4,(session->local).lang_prefs,local_a8 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_a8 & 0xffffffff);
    }
    if ((session->remote).lang_prefs == (char *)0x0) {
      uVar2 = kex_method_list(_kex_len,list_strlen_07,(LIBSSH2_COMMON_METHOD **)0x0);
      _kex_len = _kex_len + uVar2;
    }
    else {
      _libssh2_htonu32(_kex_len,list_strlen_07);
      memcpy(_kex_len + 4,(session->remote).lang_prefs,local_b0 & 0xffffffff);
      _kex_len = _kex_len + 4 + (local_b0 & 0xffffffff);
    }
    *_kex_len = '\0';
    _libssh2_htonu32(_kex_len + 1,0);
    session->kexinit_state = libssh2_NB_state_created;
  }
  else {
    s = session->kexinit_data;
    data = (uchar *)session->kexinit_data_len;
    session->kexinit_data = (uchar *)0x0;
    session->kexinit_data_len = 0;
  }
  iVar1 = _libssh2_transport_send(session,s,(size_t)data,(uchar *)0x0,0);
  if (iVar1 == -0x25) {
    session->kexinit_data = s;
    session->kexinit_data_len = (size_t)data;
    session_local._4_4_ = -0x25;
  }
  else if (iVar1 == 0) {
    if ((session->local).kexinit != (uchar *)0x0) {
      (*session->free)((session->local).kexinit,&session->abstract);
    }
    (session->local).kexinit = s;
    (session->local).kexinit_len = (size_t)data;
    session->kexinit_state = libssh2_NB_state_idle;
    session_local._4_4_ = 0;
  }
  else {
    (*session->free)(s,&session->abstract);
    session->kexinit_state = libssh2_NB_state_idle;
    session_local._4_4_ =
         _libssh2_error(session,iVar1,"Unable to send KEXINIT packet to remote host");
  }
  return session_local._4_4_;
}

Assistant:

static int kexinit(LIBSSH2_SESSION * session)
{
    /* 62 = packet_type(1) + cookie(16) + first_packet_follows(1) +
       reserved(4) + length longs(40) */
    size_t data_len = 62;
    unsigned char *data, *s;
    int rc;

    if(session->kexinit_state == libssh2_NB_state_idle) {
        uint32_t kex_len, hostkey_len;
        uint32_t crypt_cs_len, crypt_sc_len;
        uint32_t comp_cs_len, comp_sc_len;
        uint32_t mac_cs_len, mac_sc_len;
        uint32_t lang_cs_len, lang_sc_len;

        kex_len =
            LIBSSH2_METHOD_PREFS_LEN(session->kex_prefs, libssh2_kex_methods);
        hostkey_len =
            LIBSSH2_METHOD_PREFS_LEN(session->hostkey_prefs,
                                     libssh2_hostkey_methods());
        crypt_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.crypt_prefs,
                                     libssh2_crypt_methods());
        crypt_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.crypt_prefs,
                                     libssh2_crypt_methods());
        mac_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.mac_prefs,
                                     _libssh2_mac_methods());
        mac_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.mac_prefs,
                                     _libssh2_mac_methods());
        comp_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.comp_prefs,
                                     _libssh2_comp_methods(session));
        comp_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.comp_prefs,
                                     _libssh2_comp_methods(session));
        lang_cs_len =
            LIBSSH2_METHOD_PREFS_LEN(session->local.lang_prefs, NULL);
        lang_sc_len =
            LIBSSH2_METHOD_PREFS_LEN(session->remote.lang_prefs, NULL);

        data_len += kex_len + hostkey_len + crypt_cs_len + crypt_sc_len +
                    comp_cs_len + comp_sc_len + mac_cs_len + mac_sc_len +
                    lang_cs_len + lang_sc_len;

        s = data = LIBSSH2_ALLOC(session, data_len);
        if(!data) {
            return _libssh2_error(session, LIBSSH2_ERROR_ALLOC,
                                  "Unable to allocate memory");
        }

        *(s++) = SSH_MSG_KEXINIT;

        if(_libssh2_random(s, 16)) {
            return _libssh2_error(session, LIBSSH2_ERROR_RANDGEN,
                                  "Unable to get random bytes "
                                  "for KEXINIT cookie");
        }
        s += 16;

        /* Ennumerating through these lists twice is probably (certainly?)
           inefficient from a CPU standpoint, but it saves multiple
           malloc/realloc calls */
        LIBSSH2_METHOD_PREFS_STR(s, kex_len, session->kex_prefs,
                                 libssh2_kex_methods);
        LIBSSH2_METHOD_PREFS_STR(s, hostkey_len, session->hostkey_prefs,
                                 libssh2_hostkey_methods());
        LIBSSH2_METHOD_PREFS_STR(s, crypt_cs_len, session->local.crypt_prefs,
                                 libssh2_crypt_methods());
        LIBSSH2_METHOD_PREFS_STR(s, crypt_sc_len, session->remote.crypt_prefs,
                                 libssh2_crypt_methods());
        LIBSSH2_METHOD_PREFS_STR(s, mac_cs_len, session->local.mac_prefs,
                                 _libssh2_mac_methods());
        LIBSSH2_METHOD_PREFS_STR(s, mac_sc_len, session->remote.mac_prefs,
                                 _libssh2_mac_methods());
        LIBSSH2_METHOD_PREFS_STR(s, comp_cs_len, session->local.comp_prefs,
                                 _libssh2_comp_methods(session));
        LIBSSH2_METHOD_PREFS_STR(s, comp_sc_len, session->remote.comp_prefs,
                                 _libssh2_comp_methods(session));
        LIBSSH2_METHOD_PREFS_STR(s, lang_cs_len, session->local.lang_prefs,
                                 NULL);
        LIBSSH2_METHOD_PREFS_STR(s, lang_sc_len, session->remote.lang_prefs,
                                 NULL);

        /* No optimistic KEX packet follows */
        /* Deal with optimistic packets
         * session->flags |= KEXINIT_OPTIMISTIC
         * session->flags |= KEXINIT_METHODSMATCH
         */
        *(s++) = 0;

        /* Reserved == 0 */
        _libssh2_htonu32(s, 0);

#ifdef LIBSSH2DEBUG
        {
            /* Funnily enough, they'll all "appear" to be '\0' terminated */
            unsigned char *p = data + 21;   /* type(1) + cookie(16) + len(4) */

            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent KEX: %s", p));
            p += kex_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent HOSTKEY: %s", p));
            p += hostkey_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent CRYPT_CS: %s", p));
            p += crypt_cs_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent CRYPT_SC: %s", p));
            p += crypt_sc_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent MAC_CS: %s", p));
            p += mac_cs_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent MAC_SC: %s", p));
            p += mac_sc_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent COMP_CS: %s", p));
            p += comp_cs_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent COMP_SC: %s", p));
            p += comp_sc_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent LANG_CS: %s", p));
            p += lang_cs_len + 4;
            _libssh2_debug((session, LIBSSH2_TRACE_KEX,
                           "Sent LANG_SC: %s", p));
            p += lang_sc_len + 4;
        }
#endif /* LIBSSH2DEBUG */

        session->kexinit_state = libssh2_NB_state_created;
    }
    else {
        data = session->kexinit_data;
        data_len = session->kexinit_data_len;
        /* zap the variables to ensure there is NOT a double free later */
        session->kexinit_data = NULL;
        session->kexinit_data_len = 0;
    }

    rc = _libssh2_transport_send(session, data, data_len, NULL, 0);
    if(rc == LIBSSH2_ERROR_EAGAIN) {
        session->kexinit_data = data;
        session->kexinit_data_len = data_len;
        return rc;
    }
    else if(rc) {
        LIBSSH2_FREE(session, data);
        session->kexinit_state = libssh2_NB_state_idle;
        return _libssh2_error(session, rc,
                              "Unable to send KEXINIT packet to remote host");

    }

    if(session->local.kexinit) {
        LIBSSH2_FREE(session, session->local.kexinit);
    }

    session->local.kexinit = data;
    session->local.kexinit_len = data_len;

    session->kexinit_state = libssh2_NB_state_idle;

    return 0;
}